

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O1

void __thiscall Dumper::printName(Dumper *this,RWNode *node)

{
  ulong *puVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  raw_ostream *prVar5;
  raw_ostream *this_00;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  char *pcVar8;
  long lVar9;
  undefined1 auVar10 [16];
  __string_type str;
  raw_os_ostream ro;
  string nm;
  ostringstream ostr;
  ulong *local_268;
  ulong local_260;
  undefined1 local_258;
  undefined7 uStack_257;
  undefined8 uStack_250;
  ulong *local_248;
  ulong local_240;
  ulong local_238;
  undefined8 uStack_230;
  code *local_228;
  undefined4 local_220;
  long local_218;
  undefined8 uStack_210;
  long local_208;
  undefined1 local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  ostringstream *local_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  char *local_1c0;
  undefined8 local_1b8;
  char local_1b0;
  undefined7 uStack_1af;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  if (node == (RWNode *)0x0) {
    pcVar8 = "nullptr";
LAB_0011586b:
    printf(pcVar8);
    return;
  }
  if (dg::dda::UNKNOWN_MEMORY == node) {
    pcVar8 = "unknown mem";
    goto LAB_0011586b;
  }
  local_1b8 = 0;
  local_1b0 = '\0';
  local_1c0 = &local_1b0;
  prVar5 = (raw_ostream *)dg::dda::LLVMDataDependenceAnalysis::getValue((RWNode *)this->DDA);
  if (prVar5 == (raw_ostream *)0x0) {
    printRWNodeType(*(RWNodeType *)(node + 0x90));
    printf(" [%u]",(ulong)*(uint *)(node + 8));
    pcVar8 = (char *)0x0;
    goto LAB_00115c02;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_220 = 0;
  local_200 = 0;
  local_1f8 = 0;
  local_1f0 = 1;
  local_218 = 0;
  uStack_210 = 0;
  local_208 = 0;
  local_228 = std::__throw_length_error;
  local_1e8 = local_1a0;
  if (dump_c_lines[0x80] == '\x01') {
    if (0x1a < (byte)prVar5[0x10]) {
      if (*(long *)(prVar5 + 0x30) == 0) {
        p_Var6 = &valuesToVars._M_t._M_impl.super__Rb_tree_header._M_header;
        if (valuesToVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var6 = &valuesToVars._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var7 = valuesToVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (*(raw_ostream **)(p_Var7 + 1) >= prVar5) {
              p_Var6 = p_Var7;
            }
            p_Var7 = (&p_Var7->_M_left)[*(raw_ostream **)(p_Var7 + 1) < prVar5];
          } while (p_Var7 != (_Base_ptr)0x0);
        }
        p_Var7 = &valuesToVars._M_t._M_impl.super__Rb_tree_header._M_header;
        if (((_Rb_tree_header *)p_Var6 != &valuesToVars._M_t._M_impl.super__Rb_tree_header) &&
           (p_Var7 = &valuesToVars._M_t._M_impl.super__Rb_tree_header._M_header,
           *(raw_ostream **)(p_Var6 + 1) <= prVar5)) {
          p_Var7 = p_Var6;
        }
        if ((_Rb_tree_header *)p_Var7 == &valuesToVars._M_t._M_impl.super__Rb_tree_header) {
          llvm::raw_ostream::write((char *)&local_228,0x118582);
          goto LAB_001159a4;
        }
        this_00 = (raw_ostream *)
                  llvm::raw_ostream::operator<<
                            ((raw_ostream *)&local_228,(ulong)*(uint *)&p_Var7[2]._M_parent);
        if (*(undefined1 **)(this_00 + 0x18) == *(undefined1 **)(this_00 + 0x20)) {
          this_00 = (raw_ostream *)llvm::raw_ostream::write((char *)this_00,0x11858d);
        }
        else {
          **(undefined1 **)(this_00 + 0x20) = 0x3a;
          *(long *)(this_00 + 0x20) = *(long *)(this_00 + 0x20) + 1;
        }
        uVar3 = *(uint *)((long)&p_Var7[2]._M_parent + 4);
      }
      else {
        uVar3 = llvm::DebugLoc::getLine();
        this_00 = (raw_ostream *)
                  llvm::raw_ostream::operator<<((raw_ostream *)&local_228,(ulong)uVar3);
        if (*(undefined1 **)(this_00 + 0x18) == *(undefined1 **)(this_00 + 0x20)) {
          this_00 = (raw_ostream *)llvm::raw_ostream::write((char *)this_00,0x11858d);
        }
        else {
          **(undefined1 **)(this_00 + 0x20) = 0x3a;
          *(long *)(this_00 + 0x20) = *(long *)(this_00 + 0x20) + 1;
        }
        uVar3 = llvm::DebugLoc::getCol();
      }
      llvm::raw_ostream::operator<<(this_00,(ulong)uVar3);
    }
  }
  else {
LAB_001159a4:
    llvm::Value::print(prVar5,SUB81(&local_228,0));
  }
  if (local_208 != local_218) {
    llvm::raw_ostream::flush_nonempty();
  }
  std::__cxx11::stringbuf::str();
  puVar1 = local_268;
  lVar9 = -1;
  do {
    iVar4 = isspace((int)*(char *)((long)puVar1 + lVar9 + 1));
    lVar9 = lVar9 + 1;
  } while (iVar4 != 0);
  std::__cxx11::string::rfind((char *)&local_268,0x11858f,0xffffffffffffffff);
  if (lVar9 != 0) {
    std::__cxx11::string::substr((ulong)local_1e0,(ulong)&local_268);
    std::__cxx11::string::operator=((string *)&local_268,(string *)local_1e0);
    if (local_1e0[0] != local_1d0) {
      operator_delete(local_1e0[0],local_1d0[0] + 1);
    }
  }
  if ((dump_c_lines[0x80] == '\x01') || ((byte)prVar5[0x10] < 0x1b)) {
    local_248 = &local_238;
    if (local_268 == (ulong *)&local_258) {
      uStack_230 = uStack_250;
    }
    else {
      local_248 = local_268;
    }
    local_238 = CONCAT71(uStack_257,local_258);
    local_240 = local_260;
    local_260 = 0;
    local_258 = 0;
    local_268 = (ulong *)&local_258;
  }
  else {
    auVar10 = llvm::Value::getName();
    lVar9 = auVar10._0_8_;
    if (lVar9 == 0) {
      local_248 = &local_238;
      local_240 = 0;
      local_238 = local_238 & 0xffffffffffffff00;
    }
    else {
      local_248 = &local_238;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_248,lVar9,auVar10._8_8_ + lVar9);
    }
    if (0xf < local_240) {
      std::__cxx11::string::substr((ulong)local_1e0,(ulong)&local_248);
      std::__cxx11::string::operator=((string *)&local_248,(string *)local_1e0);
      if (local_1e0[0] != local_1d0) {
        operator_delete(local_1e0[0],local_1d0[0] + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_248);
    std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_268);
  }
  if (local_268 != (ulong *)&local_258) {
    operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
  }
  llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&local_228);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_248);
  pcVar8 = local_1c0;
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
    pcVar8 = local_1c0;
  }
LAB_00115c02:
  if ((prVar5 != (raw_ostream *)0x0) && (cVar2 = *pcVar8, cVar2 != '\0')) {
    lVar9 = 1;
    do {
      if (lVar9 == 0x47) {
        printf(" ...");
        break;
      }
      if (cVar2 == '\"') {
        putchar(0x5c);
      }
      putchar((int)pcVar8[lVar9 + -1]);
      cVar2 = pcVar8[lVar9];
      lVar9 = lVar9 + 1;
    } while (cVar2 != '\0');
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
  }
  return;
}

Assistant:

void printName(const RWNode *node) {
        if (node == nullptr) {
            printf("nullptr");
            return;
        }

        if (node == UNKNOWN_MEMORY) {
            printf("unknown mem");
            return;
        }

        const char *name = nullptr;

        std::string nm;
        if (!name) {
            const auto *val = DDA->getValue(node);
            if (!val) {
                printRWNodeType(node->getType());
                printId(node);
                return;
            }

            nm = getInstName(val);
            name = nm.c_str();
        }

        // escape the " character
        for (int i = 0; name[i] != '\0'; ++i) {
            // crop long names
            if (i >= 70) {
                printf(" ...");
                break;
            }

            if (name[i] == '"')
                putchar('\\');

            putchar(name[i]);
        }
    }